

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b.h
# Opt level: O3

void __thiscall
FastPForLib::Simple8b<true>::encodeArray
          (Simple8b<true> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  uint *puVar1;
  uint uVar2;
  ulong *puVar3;
  long lVar4;
  char cVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  puVar3 = (ulong *)(out + 1);
  *out = (uint32_t)length;
  if (0xef < length) {
    do {
      uVar8 = *in;
      uVar9 = (ulong)uVar8;
      if (uVar9 == 0) {
        uVar10 = 0xffffffffffffffff;
        do {
          if (uVar10 == 0x76) goto LAB_00118355;
          lVar4 = uVar10 + 2;
          uVar10 = uVar10 + 1;
        } while (in[lVar4] == 0);
        if (uVar10 < 0x77) goto LAB_00118297;
LAB_00118355:
        if (in[0x78] == 0) {
          uVar9 = 0;
          do {
            uVar10 = uVar9;
            if (uVar10 == 0x77) goto LAB_0011849b;
            uVar9 = uVar10 + 1;
          } while (in[uVar10 + 0x79] == 0);
          if (uVar10 < 0x77) goto LAB_00118362;
LAB_0011849b:
          *puVar3 = 0;
          in = in + 0xf0;
          lVar4 = -0xf0;
        }
        else {
LAB_00118362:
          in = in + 0x78;
          *puVar3 = 0x1000000000000000;
          lVar4 = -0x78;
        }
      }
      else {
LAB_00118297:
        if (uVar8 < 2) {
          uVar10 = 0xffffffffffffffff;
          do {
            if (uVar10 == 0x3a) goto LAB_0011839d;
            lVar4 = uVar10 + 2;
            uVar10 = uVar10 + 1;
          } while (in[lVar4] < 2);
          if (0x3a < uVar10) {
LAB_0011839d:
            uVar9 = 2;
            lVar4 = 0;
            do {
              puVar1 = in + lVar4;
              lVar4 = lVar4 + 1;
              uVar9 = uVar9 * 2 | (ulong)*puVar1;
            } while ((int)lVar4 != 0x3c);
            *puVar3 = uVar9;
            in = in + 0x3c;
            lVar4 = -0x3c;
            goto LAB_001187aa;
          }
        }
        if (uVar8 < 4) {
          uVar10 = 0xffffffffffffffff;
          do {
            if (uVar10 == 0x1c) goto LAB_001183f2;
            lVar4 = uVar10 + 2;
            uVar10 = uVar10 + 1;
          } while (in[lVar4] < 4);
          if (0x1c < uVar10) {
LAB_001183f2:
            uVar9 = 3;
            lVar4 = 0;
            do {
              puVar1 = in + lVar4;
              lVar4 = lVar4 + 1;
              uVar9 = uVar9 << 2 | (ulong)*puVar1;
            } while ((int)lVar4 != 0x1e);
            *puVar3 = uVar9;
            in = in + 0x1e;
            lVar4 = -0x1e;
            goto LAB_001187aa;
          }
        }
        if (uVar8 < 8) {
          uVar10 = 0xffffffffffffffff;
          do {
            if (uVar10 == 0x12) goto LAB_00118445;
            lVar4 = uVar10 + 2;
            uVar10 = uVar10 + 1;
          } while (in[lVar4] < 8);
          if (0x12 < uVar10) {
LAB_00118445:
            uVar9 = 4;
            lVar4 = 0;
            do {
              puVar1 = in + lVar4;
              lVar4 = lVar4 + 1;
              uVar9 = uVar9 << 3 | (ulong)*puVar1;
            } while ((int)lVar4 != 0x14);
            *puVar3 = uVar9;
            in = in + 0x14;
            lVar4 = -0x14;
            goto LAB_001187aa;
          }
        }
        if (uVar8 < 0x10) {
          uVar10 = 0xffffffffffffffff;
          do {
            if (uVar10 == 0xd) goto LAB_001184da;
            lVar4 = uVar10 + 2;
            uVar10 = uVar10 + 1;
          } while (in[lVar4] < 0x10);
          if (0xd < uVar10) {
LAB_001184da:
            uVar9 = 5;
            lVar4 = 0;
            do {
              puVar1 = in + lVar4;
              lVar4 = lVar4 + 1;
              uVar9 = uVar9 << 4 | (ulong)*puVar1;
            } while ((int)lVar4 != 0xf);
            *puVar3 = uVar9;
            in = in + 0xf;
            lVar4 = -0xf;
            goto LAB_001187aa;
          }
        }
        if (uVar8 < 0x20) {
          uVar10 = 0xffffffffffffffff;
          do {
            if (uVar10 == 10) goto LAB_0011852d;
            lVar4 = uVar10 + 2;
            uVar10 = uVar10 + 1;
          } while (in[lVar4] < 0x20);
          if (10 < uVar10) {
LAB_0011852d:
            uVar9 = 6;
            lVar4 = 0;
            do {
              puVar1 = in + lVar4;
              lVar4 = lVar4 + 1;
              uVar9 = uVar9 << 5 | (ulong)*puVar1;
            } while ((int)lVar4 != 0xc);
            *puVar3 = uVar9;
            in = in + 0xc;
            lVar4 = -0xc;
            goto LAB_001187aa;
          }
        }
        if (uVar8 < 0x40) {
          uVar10 = 0xffffffffffffffff;
          do {
            if (uVar10 == 8) goto LAB_00118580;
            lVar4 = uVar10 + 2;
            uVar10 = uVar10 + 1;
          } while (in[lVar4] < 0x40);
          if (8 < uVar10) {
LAB_00118580:
            uVar9 = 7;
            lVar4 = 0;
            do {
              puVar1 = in + lVar4;
              lVar4 = lVar4 + 1;
              uVar9 = uVar9 << 6 | (ulong)*puVar1;
            } while ((int)lVar4 != 10);
            *puVar3 = uVar9;
            in = in + 10;
            lVar4 = -10;
            goto LAB_001187aa;
          }
        }
        if (uVar8 < 0x80) {
          uVar10 = 0xffffffffffffffff;
          do {
            if (uVar10 == 6) goto LAB_001185d6;
            lVar4 = uVar10 + 2;
            uVar10 = uVar10 + 1;
          } while (in[lVar4] < 0x80);
          if (6 < uVar10) {
LAB_001185d6:
            uVar9 = 8;
            lVar4 = 0;
            do {
              puVar1 = in + lVar4;
              lVar4 = lVar4 + 1;
              uVar9 = uVar9 << 7 | (ulong)*puVar1;
            } while ((int)lVar4 != 8);
            in = in + 8;
            *puVar3 = uVar9 << 4;
            lVar4 = -8;
            goto LAB_001187aa;
          }
        }
        if (uVar8 < 0x100) {
          uVar10 = 0xffffffffffffffff;
          do {
            if (uVar10 == 5) goto LAB_00118630;
            lVar4 = uVar10 + 2;
            uVar10 = uVar10 + 1;
          } while (in[lVar4] < 0x100);
          if (5 < uVar10) {
LAB_00118630:
            uVar9 = 9;
            lVar4 = 0;
            do {
              puVar1 = in + lVar4;
              lVar4 = lVar4 + 1;
              uVar9 = uVar9 << 8 | (ulong)*puVar1;
            } while ((int)lVar4 != 7);
            in = in + 7;
            *puVar3 = uVar9 << 4;
            lVar4 = -7;
            goto LAB_001187aa;
          }
        }
        if (uVar8 < 0x400) {
          uVar10 = 0xffffffffffffffff;
          do {
            if (uVar10 == 4) goto LAB_0011868a;
            lVar4 = uVar10 + 2;
            uVar10 = uVar10 + 1;
          } while (in[lVar4] < 0x400);
          if (4 < uVar10) {
LAB_0011868a:
            uVar9 = 10;
            lVar4 = 0;
            do {
              puVar1 = in + lVar4;
              lVar4 = lVar4 + 1;
              uVar9 = uVar9 << 10 | (ulong)*puVar1;
            } while ((int)lVar4 != 6);
            *puVar3 = uVar9;
            in = in + 6;
            lVar4 = -6;
            goto LAB_001187aa;
          }
        }
        if (uVar8 < 0x1000) {
          uVar10 = 0xffffffffffffffff;
          do {
            if (uVar10 == 3) goto LAB_001186e0;
            lVar4 = uVar10 + 2;
            uVar10 = uVar10 + 1;
          } while (in[lVar4] < 0x1000);
          if (3 < uVar10) {
LAB_001186e0:
            uVar9 = 0xb;
            lVar4 = 0;
            do {
              puVar1 = in + lVar4;
              lVar4 = lVar4 + 1;
              uVar9 = uVar9 << 0xc | (ulong)*puVar1;
            } while ((int)lVar4 != 5);
            *puVar3 = uVar9;
            in = in + 5;
            lVar4 = -5;
            goto LAB_001187aa;
          }
        }
        if (uVar8 < 0x8000) {
          uVar10 = 0xffffffffffffffff;
          do {
            if (uVar10 == 2) goto LAB_00118736;
            lVar4 = uVar10 + 2;
            uVar10 = uVar10 + 1;
          } while (in[lVar4] < 0x8000);
          if (2 < uVar10) {
LAB_00118736:
            uVar9 = 0xc;
            lVar4 = 0;
            do {
              puVar1 = in + lVar4;
              lVar4 = lVar4 + 1;
              uVar9 = uVar9 << 0xf | (ulong)*puVar1;
            } while ((int)lVar4 != 4);
            *puVar3 = uVar9;
            in = in + 4;
            lVar4 = -4;
            goto LAB_001187aa;
          }
        }
        if (uVar8 < 0x100000) {
          if ((0xfffff < in[1]) || (0xfffff < in[2])) goto LAB_00118773;
          uVar9 = 0xd;
          lVar4 = 0;
          do {
            puVar1 = in + lVar4;
            lVar4 = lVar4 + 1;
            uVar9 = uVar9 << 0x14 | (ulong)*puVar1;
          } while ((int)lVar4 != 3);
          *puVar3 = uVar9;
          in = in + 3;
          lVar4 = -3;
        }
        else {
          if (uVar8 < 0x40000000) {
LAB_00118773:
            puVar1 = in + 1;
            if ((ulong)*puVar1 < 0x40000000) {
              in = in + 2;
              *puVar3 = uVar9 << 0x1e | 0xe000000000000000 | (ulong)*puVar1;
              lVar4 = -2;
              goto LAB_001187aa;
            }
          }
          in = in + 1;
          *puVar3 = uVar9 | 0xf000000000000000;
          lVar4 = -1;
        }
      }
LAB_001187aa:
      length = length + lVar4;
      puVar3 = puVar3 + 1;
    } while (0xef < length);
  }
  do {
    if (length == 0) {
      *nvalue = (long)puVar3 - (long)out >> 2;
      return;
    }
    uVar8 = (uint)length;
    if (uVar8 == 0) {
LAB_00118b8b:
      bVar11 = length < 0xf0;
      uVar9 = 0xf0;
      *puVar3 = 0;
LAB_00118b9b:
      if (bVar11) {
        uVar9 = length;
      }
      uVar8 = (uint)uVar9;
      in = in + (uVar9 & 0xffffffff);
    }
    else {
      uVar6 = *in;
      uVar9 = 0xf0;
      if (uVar8 < 0xf0) {
        uVar9 = length & 0xffffffff;
      }
      if ((ulong)uVar6 == 0) {
        uVar10 = 1;
        do {
          uVar7 = uVar10;
          if (uVar9 == uVar7) break;
          uVar10 = uVar7 + 1;
        } while (in[uVar7] == 0);
        if (uVar9 <= uVar7) goto LAB_00118b8b;
        uVar9 = 0x78;
        if (uVar8 < 0x78) {
          uVar9 = length & 0xffffffff;
        }
        uVar10 = 1;
        do {
          uVar7 = uVar10;
          if (uVar9 == uVar7) break;
          uVar10 = uVar7 + 1;
        } while (in[uVar7] == 0);
        if (uVar7 < uVar9) goto LAB_0011882a;
        bVar11 = length < 0x78;
        uVar9 = 0x78;
        *puVar3 = 0x1000000000000000;
        goto LAB_00118b9b;
      }
LAB_0011882a:
      uVar9 = 0x3c;
      if (uVar8 < 0x3c) {
        uVar9 = length & 0xffffffff;
      }
      if (uVar6 < 2) {
        uVar10 = 1;
        do {
          uVar7 = uVar10;
          if (uVar9 == uVar7) break;
          uVar10 = uVar7 + 1;
        } while (in[uVar7] < 2);
        if (uVar7 < uVar9) goto LAB_00118860;
        uVar10 = 2;
        uVar9 = 0x3c;
        if (length < 0x3c) {
          uVar9 = length;
        }
        uVar8 = (uint)uVar9;
        uVar7 = 1;
        if (1 < uVar8) {
          uVar7 = uVar9 & 0xffffffff;
        }
        do {
          uVar6 = *in;
          in = in + 1;
          uVar10 = uVar10 * 2 | (ulong)uVar6;
          uVar6 = (int)uVar7 - 1;
          uVar7 = (ulong)uVar6;
        } while (uVar6 != 0);
        uVar9 = (ulong)(byte)(0x3c - (char)uVar9);
LAB_00118be5:
        uVar10 = uVar10 << (uVar9 & 0x3f);
LAB_00118e8f:
        *puVar3 = uVar10;
      }
      else {
LAB_00118860:
        uVar9 = 0x1e;
        if (uVar8 < 0x1e) {
          uVar9 = length & 0xffffffff;
        }
        if (uVar6 < 4) {
          uVar10 = 1;
          do {
            uVar7 = uVar10;
            if (uVar9 == uVar7) break;
            uVar10 = uVar7 + 1;
          } while (in[uVar7] < 4);
          if (uVar7 < uVar9) goto LAB_00118896;
          uVar10 = 3;
          uVar9 = 0x1e;
          if (length < 0x1e) {
            uVar9 = length;
          }
          uVar8 = (uint)uVar9;
          uVar7 = 1;
          if (1 < uVar8) {
            uVar7 = uVar9 & 0xffffffff;
          }
          do {
            uVar6 = *in;
            in = in + 1;
            uVar10 = uVar10 << 2 | (ulong)uVar6;
            uVar6 = (int)uVar7 - 1;
            uVar7 = (ulong)uVar6;
          } while (uVar6 != 0);
          cVar5 = (char)uVar9 * '\x02';
LAB_00118da4:
          uVar9 = (ulong)(byte)(0x3c - cVar5);
LAB_00118e8a:
          uVar10 = uVar10 << (uVar9 & 0x3f);
          goto LAB_00118e8f;
        }
LAB_00118896:
        uVar9 = 0x14;
        if (uVar8 < 0x14) {
          uVar9 = length & 0xffffffff;
        }
        if (uVar6 < 8) {
          uVar10 = 1;
          do {
            uVar7 = uVar10;
            if (uVar9 == uVar7) break;
            uVar10 = uVar7 + 1;
          } while (in[uVar7] < 8);
          if (uVar7 < uVar9) goto LAB_001188cc;
          uVar10 = 4;
          uVar9 = 0x14;
          if (length < 0x14) {
            uVar9 = length;
          }
          uVar8 = (uint)uVar9;
          uVar7 = 1;
          if (1 < uVar8) {
            uVar7 = uVar9 & 0xffffffff;
          }
          do {
            uVar6 = *in;
            in = in + 1;
            uVar10 = uVar10 << 3 | (ulong)uVar6;
            uVar6 = (int)uVar7 - 1;
            uVar7 = (ulong)uVar6;
          } while (uVar6 != 0);
          cVar5 = -3;
LAB_00118e7f:
          uVar9 = (ulong)(byte)((char)uVar8 * cVar5 + 0x3c);
          goto LAB_00118e8a;
        }
LAB_001188cc:
        uVar9 = 0xf;
        if (uVar8 < 0xf) {
          uVar9 = length & 0xffffffff;
        }
        if (uVar6 < 0x10) {
          uVar10 = 1;
          do {
            uVar7 = uVar10;
            if (uVar9 == uVar7) break;
            uVar10 = uVar7 + 1;
          } while (in[uVar7] < 0x10);
          if (uVar9 <= uVar7) {
            uVar10 = 5;
            uVar9 = 0xf;
            if (length < 0xf) {
              uVar9 = length;
            }
            uVar8 = (uint)uVar9;
            uVar7 = 1;
            if (1 < uVar8) {
              uVar7 = uVar9 & 0xffffffff;
            }
            do {
              uVar6 = *in;
              in = in + 1;
              uVar10 = uVar10 << 4 | (ulong)uVar6;
              uVar6 = (int)uVar7 - 1;
              uVar7 = (ulong)uVar6;
            } while (uVar6 != 0);
            cVar5 = (char)(uVar8 << 2);
            goto LAB_00118da4;
          }
        }
        uVar9 = 0xc;
        if (uVar8 < 0xc) {
          uVar9 = length & 0xffffffff;
        }
        if (uVar6 < 0x20) {
          uVar10 = 1;
          do {
            uVar7 = uVar10;
            if (uVar9 == uVar7) break;
            uVar10 = uVar7 + 1;
          } while (in[uVar7] < 0x20);
          if (uVar9 <= uVar7) {
            uVar10 = 6;
            uVar9 = 0xc;
            if (length < 0xc) {
              uVar9 = length;
            }
            uVar8 = (uint)uVar9;
            uVar7 = 1;
            if (1 < uVar8) {
              uVar7 = uVar9 & 0xffffffff;
            }
            do {
              uVar6 = *in;
              in = in + 1;
              uVar10 = uVar10 << 5 | (ulong)uVar6;
              uVar6 = (int)uVar7 - 1;
              uVar7 = (ulong)uVar6;
            } while (uVar6 != 0);
            cVar5 = -5;
            goto LAB_00118e7f;
          }
        }
        uVar9 = 10;
        if (uVar8 < 10) {
          uVar9 = length & 0xffffffff;
        }
        if (uVar6 < 0x40) {
          uVar10 = 1;
          do {
            uVar7 = uVar10;
            if (uVar9 == uVar7) break;
            uVar10 = uVar7 + 1;
          } while (in[uVar7] < 0x40);
          if (uVar7 < uVar9) goto LAB_0011896e;
          uVar10 = 7;
          uVar9 = 10;
          if (length < 10) {
            uVar9 = length;
          }
          uVar8 = (uint)uVar9;
          uVar7 = 1;
          if (1 < uVar8) {
            uVar7 = uVar9 & 0xffffffff;
          }
          do {
            uVar6 = *in;
            in = in + 1;
            uVar10 = uVar10 << 6 | (ulong)uVar6;
            uVar6 = (int)uVar7 - 1;
            uVar7 = (ulong)uVar6;
          } while (uVar6 != 0);
          cVar5 = -6;
LAB_00118de8:
          uVar9 = (ulong)(byte)((char)uVar8 * cVar5 + 0x3c);
          goto LAB_00118e8a;
        }
LAB_0011896e:
        uVar9 = 8;
        if (uVar8 < 8) {
          uVar9 = length & 0xffffffff;
        }
        if (uVar6 < 0x80) {
          uVar10 = 1;
          do {
            uVar7 = uVar10;
            if (uVar9 == uVar7) break;
            uVar10 = uVar7 + 1;
          } while (in[uVar7] < 0x80);
          if (uVar9 <= uVar7) {
            uVar10 = 8;
            uVar9 = 8;
            if (length < 8) {
              uVar9 = length;
            }
            uVar8 = (uint)uVar9;
            uVar7 = 1;
            if (1 < uVar8) {
              uVar7 = uVar9 & 0xffffffff;
            }
            do {
              uVar6 = *in;
              in = in + 1;
              uVar10 = uVar10 << 7 | (ulong)uVar6;
              uVar6 = (int)uVar7 - 1;
              uVar7 = (ulong)uVar6;
            } while (uVar6 != 0);
            cVar5 = -7;
            goto LAB_00118e7f;
          }
        }
        uVar9 = 7;
        if (uVar8 < 7) {
          uVar9 = length & 0xffffffff;
        }
        if (uVar6 < 0x100) {
          uVar10 = 1;
          do {
            uVar7 = uVar10;
            if (uVar9 == uVar7) break;
            uVar10 = uVar7 + 1;
          } while (in[uVar7] < 0x100);
          if (uVar9 <= uVar7) {
            uVar10 = 9;
            uVar9 = 7;
            if (length < 7) {
              uVar9 = length;
            }
            uVar8 = (uint)uVar9;
            uVar7 = 1;
            if (1 < uVar8) {
              uVar7 = uVar9 & 0xffffffff;
            }
            do {
              uVar6 = *in;
              in = in + 1;
              uVar10 = uVar10 << 8 | (ulong)uVar6;
              uVar6 = (int)uVar7 - 1;
              uVar7 = (ulong)uVar6;
            } while (uVar6 != 0);
            cVar5 = (char)(uVar8 << 3);
            goto LAB_00118da4;
          }
        }
        uVar9 = 6;
        if (uVar8 < 6) {
          uVar9 = length & 0xffffffff;
        }
        if (uVar6 < 0x400) {
          uVar10 = 1;
          do {
            uVar7 = uVar10;
            if (uVar9 == uVar7) break;
            uVar10 = uVar7 + 1;
          } while (in[uVar7] < 0x400);
          if (uVar9 <= uVar7) {
            uVar10 = 10;
            uVar9 = 6;
            if (length < 6) {
              uVar9 = length;
            }
            uVar8 = (uint)uVar9;
            uVar7 = 1;
            if (1 < uVar8) {
              uVar7 = uVar9 & 0xffffffff;
            }
            do {
              uVar6 = *in;
              in = in + 1;
              uVar10 = uVar10 << 10 | (ulong)uVar6;
              uVar6 = (int)uVar7 - 1;
              uVar7 = (ulong)uVar6;
            } while (uVar6 != 0);
            cVar5 = -10;
            goto LAB_00118de8;
          }
        }
        uVar9 = 5;
        if (uVar8 < 5) {
          uVar9 = length & 0xffffffff;
        }
        if (uVar6 < 0x1000) {
          uVar10 = 1;
          do {
            uVar7 = uVar10;
            if (uVar9 == uVar7) break;
            uVar10 = uVar7 + 1;
          } while (in[uVar7] < 0x1000);
          if (uVar9 <= uVar7) {
            uVar10 = 0xb;
            uVar9 = 5;
            if (length < 5) {
              uVar9 = length;
            }
            uVar8 = (uint)uVar9;
            uVar7 = 1;
            if (1 < uVar8) {
              uVar7 = uVar9 & 0xffffffff;
            }
            do {
              uVar6 = *in;
              in = in + 1;
              uVar10 = uVar10 << 0xc | (ulong)uVar6;
              uVar6 = (int)uVar7 - 1;
              uVar7 = (ulong)uVar6;
            } while (uVar6 != 0);
            uVar9 = (ulong)(byte)((char)uVar9 * -0xc + 0x3c);
            goto LAB_00118e8a;
          }
        }
        uVar9 = 4;
        if (uVar8 < 4) {
          uVar9 = length & 0xffffffff;
        }
        if (uVar6 < 0x8000) {
          uVar10 = 1;
          do {
            uVar7 = uVar10;
            if (uVar9 == uVar7) break;
            uVar10 = uVar7 + 1;
          } while (in[uVar7] < 0x8000);
          if (uVar9 <= uVar7) {
            uVar10 = 0xc;
            uVar9 = 4;
            if (length < 4) {
              uVar9 = length;
            }
            uVar8 = (uint)uVar9;
            uVar7 = 1;
            if (1 < uVar8) {
              uVar7 = uVar9 & 0xffffffff;
            }
            do {
              uVar6 = *in;
              in = in + 1;
              uVar10 = uVar10 << 0xf | (ulong)uVar6;
              uVar6 = (int)uVar7 - 1;
              uVar7 = (ulong)uVar6;
            } while (uVar6 != 0);
            cVar5 = -0xf;
            goto LAB_00118e7f;
          }
        }
        uVar9 = 3;
        if (uVar8 < 3) {
          uVar9 = length & 0xffffffff;
        }
        if (uVar6 < 0x100000) {
          uVar10 = 1;
          do {
            uVar7 = uVar10;
            if (uVar9 == uVar7) break;
            uVar10 = uVar7 + 1;
          } while (in[uVar7] < 0x100000);
          if (uVar9 <= uVar7) {
            uVar10 = 0xd;
            uVar9 = 3;
            if (length < 3) {
              uVar9 = length;
            }
            uVar8 = (uint)uVar9;
            uVar7 = 1;
            if (1 < uVar8) {
              uVar7 = uVar9 & 0xffffffff;
            }
            do {
              uVar6 = *in;
              in = in + 1;
              uVar10 = uVar10 << 0x14 | (ulong)uVar6;
              uVar6 = (int)uVar7 - 1;
              uVar7 = (ulong)uVar6;
            } while (uVar6 != 0);
            uVar9 = (ulong)(byte)((char)uVar9 * -0x14 + 0x3c);
            goto LAB_00118be5;
          }
        }
        uVar9 = 2;
        if (uVar8 < 2) {
          uVar9 = length & 0xffffffff;
        }
        if (uVar6 < 0x40000000) {
          uVar10 = 1;
          do {
            uVar7 = uVar10;
            if (uVar9 == uVar7) break;
            uVar10 = uVar7 + 1;
          } while (in[uVar7] < 0x40000000);
          if (uVar9 <= uVar7) {
            uVar10 = 0xe;
            uVar8 = (length != 1) + 1;
            uVar6 = uVar8;
            do {
              uVar2 = *in;
              in = in + 1;
              uVar10 = uVar10 << 0x1e | (ulong)uVar2;
              uVar6 = uVar6 - 1;
            } while (uVar6 != 0);
            uVar9 = (ulong)(byte)((char)(-0x1e << (length != 1)) + 0x3c);
            goto LAB_00118be5;
          }
        }
        in = in + 1;
        *puVar3 = (ulong)uVar6 | 0xf000000000000000;
        uVar8 = 1;
      }
    }
    puVar3 = puVar3 + 1;
    length = length - uVar8;
  } while( true );
}

Assistant:

void Simple8b<MarkLength>::encodeArray(const uint32_t *in, const size_t length,
                                       uint32_t *out, size_t &nvalue) {
#ifndef NDEBUG
  const uint32_t *const initin(in);
#endif
  uint32_t NumberOfValuesCoded = 0;
  const uint32_t *const initout(out);
  if (MarkLength) {
    *out = static_cast<uint32_t>(length);
    ++out;
  }
  // this may lead to unaligned access. Performance may be affected.
  // not much of an effect in practice on recent Intel processors.
  uint64_t *out64 = reinterpret_cast<uint64_t *>(out);
  size_t ValuesRemaining(length);
  // precompute
  const bool becareful(false);
  while (ValuesRemaining >= 240) {
    if (trymefull<120, 0>(in)) {
      if (trymefull<120, 0>(in + 120)) {
        NumberOfValuesCoded = 240;
        out64[0] = 0;
        in += NumberOfValuesCoded;
        if (becareful)
          assert(which(out64) == 0);

      } else {
        NumberOfValuesCoded = 120;
        out64[0] = 1ULL << (64 - SIMPLE8B_LOGDESC);
        in += NumberOfValuesCoded;
        if (becareful)
          assert(which(out64) == 1);
      }
    } else if (trymefull<60, 1>(in)) {
      out64[0] = 2;
      NumberOfValuesCoded = 60;
      for (uint32_t i = 0; i < 60; i++) {
        bit_writer(out64, *in++, 1);
      }
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 1 * 60;
      if (becareful)
        assert(which(out64) == 2);
    } else if (trymefull<30, 2>(in)) {
      out64[0] = 3;
      NumberOfValuesCoded = 30;
      for (uint32_t i = 0; i < 30; i++)
        bit_writer(out64, *in++, 2);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 2 * 30;
      if (becareful)
        assert(which(out64) == 3);
    } else if (trymefull<20, 3>(in)) {
      out64[0] = 4;
      NumberOfValuesCoded = 20;
      for (uint32_t i = 0; i < 20; i++)
        bit_writer(out64, *in++, 3);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 3 * 20;
      if (becareful)
        assert(which(out64) == 4);
    } else if (trymefull<15, 4>(in)) {
      out64[0] = 5;
      NumberOfValuesCoded = 15;
      for (uint32_t i = 0; i < 15; i++)
        bit_writer(out64, *in++, 4);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 4 * 15;
      if (becareful)
        assert(which(out64) == 5);
    } else if (trymefull<12, 5>(in)) {
      out64[0] = 6;
      NumberOfValuesCoded = 12;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 5);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 5 * 12;
      if (becareful)
        assert(which(out64) == 6);
    } else if (trymefull<10, 6>(in)) {
      out64[0] = 7;
      NumberOfValuesCoded = 10;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 6);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 6 * 10;
      if (becareful)
        assert(which(out64) == 7);
    } else if (trymefull<8, 7>(in)) {
      out64[0] = 8;
      NumberOfValuesCoded = 8;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 7);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 7 * 8;
      if (becareful)
        assert(which(out64) == 8);
    } else if (trymefull<7, 8>(in)) {
      out64[0] = 9;
      NumberOfValuesCoded = 7;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 8);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 8 * 7;
      if (becareful)
        assert(which(out64) == 9);
    } else if (trymefull<6, 10>(in)) {
      out64[0] = 10;
      NumberOfValuesCoded = 6;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 10);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 10 * 6;
      if (becareful)
        assert(which(out64) == 10);
    } else if (trymefull<5, 12>(in)) {
      out64[0] = 11;
      NumberOfValuesCoded =
          (ValuesRemaining < 5) ? static_cast<uint32_t>(ValuesRemaining) : 5;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 12);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 12 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 11);
    } else if (trymefull<4, 15>(in)) {
      out64[0] = 12;
      NumberOfValuesCoded = 4;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 15);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 15 * 4;
      if (becareful)
        assert(which(out64) == 12);
    } else if (trymefull<3, 20>(in)) {
      out64[0] = 13;
      NumberOfValuesCoded = 3;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 20);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 20 * 3;
      if (becareful)
        assert(which(out64) == 13);
    } else if (trymefull<2, 30>(in)) {
      out64[0] = 14;
      NumberOfValuesCoded = 2;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 30);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 30 * 2;
      if (becareful)
        assert(which(out64) == 14);
    } else if (trymefull<1, 60>(in)) {
      out64[0] = 15;
      NumberOfValuesCoded = 1;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 60);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 60 * 1;
      if (becareful)
        assert(which(out64) == 15);
    } else {
      throw std::logic_error("shouldn't happen");
    }
    ++out64;

    ValuesRemaining -= NumberOfValuesCoded;
  }

  while (ValuesRemaining > 0) {
    if (tryme<240, 0>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 240)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 240;
      out64[0] = 0;
      in += NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 0);
    } else if (tryme<120, 0>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 120)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 120;
      out64[0] = 1ULL << (64 - SIMPLE8B_LOGDESC);
      in += NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 1);
    } else if (tryme<60, 1>(in, ValuesRemaining)) {
      out64[0] = 2;
      NumberOfValuesCoded =
          (ValuesRemaining < 60) ? static_cast<uint32_t>(ValuesRemaining) : 60;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++) {
        bit_writer(out64, *in++, 1);
      }
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 1 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 2);
    } else if (tryme<30, 2>(in, ValuesRemaining)) {
      out64[0] = 3;
      NumberOfValuesCoded =
          (ValuesRemaining < 30) ? static_cast<uint32_t>(ValuesRemaining) : 30;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 2);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 2 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 3);
    } else if (tryme<20, 3>(in, ValuesRemaining)) {
      out64[0] = 4;
      NumberOfValuesCoded =
          (ValuesRemaining < 20) ? static_cast<uint32_t>(ValuesRemaining) : 20;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 3);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 3 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 4);
    } else if (tryme<15, 4>(in, ValuesRemaining)) {
      out64[0] = 5;
      NumberOfValuesCoded =
          (ValuesRemaining < 15) ? static_cast<uint32_t>(ValuesRemaining) : 15;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 4);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 4 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 5);
    } else if (tryme<12, 5>(in, ValuesRemaining)) {
      out64[0] = 6;
      NumberOfValuesCoded =
          (ValuesRemaining < 12) ? static_cast<uint32_t>(ValuesRemaining) : 12;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 5);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 5 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 6);
    } else if (tryme<10, 6>(in, ValuesRemaining)) {
      out64[0] = 7;
      NumberOfValuesCoded =
          (ValuesRemaining < 10) ? static_cast<uint32_t>(ValuesRemaining) : 10;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 6);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 6 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 7);
    } else if (tryme<8, 7>(in, ValuesRemaining)) {
      out64[0] = 8;
      NumberOfValuesCoded =
          (ValuesRemaining < 8) ? static_cast<uint32_t>(ValuesRemaining) : 8;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 7);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 7 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 8);
    } else if (tryme<7, 8>(in, ValuesRemaining)) {
      out64[0] = 9;
      NumberOfValuesCoded =
          (ValuesRemaining < 7) ? static_cast<uint32_t>(ValuesRemaining) : 7;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 8);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 8 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 9);
    } else if (tryme<6, 10>(in, ValuesRemaining)) {
      out64[0] = 10;
      NumberOfValuesCoded =
          (ValuesRemaining < 6) ? static_cast<uint32_t>(ValuesRemaining) : 6;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 10);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 10 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 10);
    } else if (tryme<5, 12>(in, ValuesRemaining)) {
      out64[0] = 11;
      NumberOfValuesCoded =
          (ValuesRemaining < 5) ? static_cast<uint32_t>(ValuesRemaining) : 5;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 12);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 12 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 11);
    } else if (tryme<4, 15>(in, ValuesRemaining)) {
      out64[0] = 12;
      NumberOfValuesCoded =
          (ValuesRemaining < 4) ? static_cast<uint32_t>(ValuesRemaining) : 4;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 15);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 15 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 12);
    } else if (tryme<3, 20>(in, ValuesRemaining)) {
      out64[0] = 13;
      NumberOfValuesCoded =
          (ValuesRemaining < 3) ? static_cast<uint32_t>(ValuesRemaining) : 3;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 20);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 20 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 13);
    } else if (tryme<2, 30>(in, ValuesRemaining)) {
      out64[0] = 14;
      NumberOfValuesCoded =
          (ValuesRemaining < 2) ? static_cast<uint32_t>(ValuesRemaining) : 2;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 30);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 30 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 14);
    } else if (tryme<1, 60>(in, ValuesRemaining)) {
      out64[0] = 15;
      NumberOfValuesCoded = (ValuesRemaining < 1) ? uint32_t(ValuesRemaining) : 1;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 60);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 60 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 15);
    } else {
      throw std::logic_error("shouldn't happen");
    }
    if (becareful)
      ASSERT(initin + length - ValuesRemaining + NumberOfValuesCoded == in,
          std::to_string(which(out64)));
    ++out64;

    ValuesRemaining -= NumberOfValuesCoded;
  }
  assert(initin + length == in);
  nvalue = reinterpret_cast<uint32_t *>(out64) - initout;
}